

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O1

int Saig_ManSimDataInit2(Aig_Man_t *p,Abc_Cex_t *pCex,Vec_Ptr_t *vSimInfo)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  void *pvVar4;
  Aig_Obj_t *pObj;
  bool bVar5;
  Vec_Ptr_t *pVVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint *pInfo_3;
  uint *pInfo_2;
  ulong uVar15;
  uint local_34;
  
  if (p->nRegs < 1) {
    local_34 = 0;
  }
  else {
    pVVar6 = p->vCis;
    local_34 = 0;
    do {
      uVar9 = p->nTruePis + local_34;
      if (((int)uVar9 < 0) || (pVVar6->nSize <= (int)uVar9)) goto LAB_006129c7;
      uVar10 = local_34 >> 5;
      uVar11 = local_34 & 0x1f;
      iVar14 = *(int *)((long)pVVar6->pArray[uVar9] + 0x24);
      if (((long)iVar14 < 0) || (vSimInfo->nSize <= iVar14)) goto LAB_006129c7;
      local_34 = local_34 + 1;
      *(uint *)vSimInfo->pArray[iVar14] =
           *vSimInfo->pArray[iVar14] & 0xfffffffc |
           (uint)(((uint)(&pCex[1].iPo)[uVar10] >> uVar11 & 1) != 0);
    } while ((int)local_34 < p->nRegs);
  }
  if (-1 < pCex->iFrame) {
    uVar9 = 0;
    do {
      iVar14 = p->pConst1->Id;
      if (((long)iVar14 < 0) || (vSimInfo->nSize <= iVar14)) goto LAB_006129c7;
      ppvVar3 = vSimInfo->pArray;
      pvVar4 = ppvVar3[iVar14];
      uVar15 = (ulong)(uVar9 >> 4);
      uVar11 = *(uint *)((long)pvVar4 + uVar15 * 4);
      bVar7 = (char)uVar9 * '\x02' & 0x1e;
      *(uint *)((long)pvVar4 + uVar15 * 4) = (uVar11 >> bVar7 & 3 ^ 1) << bVar7 ^ uVar11;
      if (0 < p->nTruePis) {
        pVVar6 = p->vCis;
        lVar12 = 0;
        do {
          if (pVVar6->nSize <= lVar12) goto LAB_006129c7;
          uVar11 = local_34 + (int)lVar12;
          iVar14 = *(int *)((long)pVVar6->pArray[lVar12] + 0x24);
          if (((long)iVar14 < 0) || (vSimInfo->nSize <= iVar14)) goto LAB_006129c7;
          pvVar4 = ppvVar3[iVar14];
          uVar10 = *(uint *)((long)pvVar4 + uVar15 * 4);
          *(uint *)((long)pvVar4 + uVar15 * 4) =
               (uVar10 >> bVar7 & 3 ^
               (uint)(((uint)(&pCex[1].iPo)[(int)uVar11 >> 5] >> (uVar11 & 0x1f) & 1) != 0)) <<
               bVar7 ^ uVar10;
          lVar12 = lVar12 + 1;
        } while (lVar12 < p->nTruePis);
        local_34 = local_34 + (int)lVar12;
      }
      pVVar6 = p->vObjs;
      if (0 < pVVar6->nSize) {
        lVar12 = 0;
        do {
          pObj = (Aig_Obj_t *)pVVar6->pArray[lVar12];
          if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
            Saig_ManExtendOneEval2(vSimInfo,pObj,uVar9);
          }
          lVar12 = lVar12 + 1;
          pVVar6 = p->vObjs;
        } while (lVar12 < pVVar6->nSize);
      }
      pVVar6 = p->vCos;
      if (0 < pVVar6->nSize) {
        lVar12 = 0;
        do {
          Saig_ManExtendOneEval2(vSimInfo,(Aig_Obj_t *)pVVar6->pArray[lVar12],uVar9);
          lVar12 = lVar12 + 1;
          pVVar6 = p->vCos;
        } while (lVar12 < pVVar6->nSize);
      }
      if (uVar9 == pCex->iFrame) break;
      if (0 < p->nRegs) {
        uVar13 = (ulong)(uVar9 + 1 >> 4);
        bVar8 = (char)uVar9 * '\x02' + 2U & 0x1e;
        iVar14 = 0;
        do {
          uVar11 = p->nTruePos + iVar14;
          if (((((int)uVar11 < 0) || (pVVar6->nSize <= (int)uVar11)) ||
              (uVar10 = p->nTruePis + iVar14, (int)uVar10 < 0)) || (p->vCis->nSize <= (int)uVar10))
          goto LAB_006129c7;
          iVar1 = *(int *)((long)pVVar6->pArray[uVar11] + 0x24);
          if (((long)iVar1 < 0) || (vSimInfo->nSize <= iVar1)) goto LAB_006129c7;
          iVar2 = *(int *)((long)p->vCis->pArray[uVar10] + 0x24);
          if (((long)iVar2 < 0) || (vSimInfo->nSize <= iVar2)) goto LAB_006129c7;
          pvVar4 = vSimInfo->pArray[iVar2];
          uVar11 = *(uint *)((long)pvVar4 + uVar13 * 4);
          *(uint *)((long)pvVar4 + uVar13 * 4) =
               ((uVar11 >> bVar8 ^ *(uint *)((long)vSimInfo->pArray[iVar1] + uVar15 * 4) >> bVar7) &
               3) << bVar8 ^ uVar11;
          iVar14 = iVar14 + 1;
        } while (iVar14 < p->nRegs);
      }
      bVar5 = (int)uVar9 < pCex->iFrame;
      uVar9 = uVar9 + 1;
    } while (bVar5);
  }
  iVar14 = pCex->iPo;
  if ((-1 < (long)iVar14) && (iVar14 < p->vCos->nSize)) {
    iVar14 = *(int *)((long)p->vCos->pArray[iVar14] + 0x24);
    if ((-1 < (long)iVar14) && (iVar14 < vSimInfo->nSize)) {
      return *(uint *)((long)vSimInfo->pArray[iVar14] + (long)(pCex->iFrame >> 4) * 4) >>
             ((char)pCex->iFrame * '\x02' & 0x1fU) & 3;
    }
  }
LAB_006129c7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_ManSimDataInit2( Aig_Man_t * p, Abc_Cex_t * pCex, Vec_Ptr_t * vSimInfo )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f, iBit = 0;
    Saig_ManForEachLo( p, pObj, i )
        Saig_ManSimInfo2Set( vSimInfo, pObj, 0, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE_NEW:SAIG_ZER_NEW );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Saig_ManSimInfo2Set( vSimInfo, Aig_ManConst1(p), f, SAIG_ONE_NEW );
        Saig_ManForEachPi( p, pObj, i )
            Saig_ManSimInfo2Set( vSimInfo, pObj, f, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE_NEW:SAIG_ZER_NEW );
        Aig_ManForEachNode( p, pObj, i )
            Saig_ManExtendOneEval2( vSimInfo, pObj, f );
        Aig_ManForEachCo( p, pObj, i )
            Saig_ManExtendOneEval2( vSimInfo, pObj, f );
        if ( f == pCex->iFrame )
            break;
        Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
            Saig_ManSimInfo2Set( vSimInfo, pObjLo, f+1, Saig_ManSimInfo2Get(vSimInfo, pObjLi, f) );
    }
    // make sure the output of the property failed
    pObj = Aig_ManCo( p, pCex->iPo );
    return Saig_ManSimInfo2Get( vSimInfo, pObj, pCex->iFrame );
}